

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O0

double CubicRoot(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  undefined8 local_8;
  
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    if (0.0 <= in_XMM0_Qa) {
      dVar1 = log(in_XMM0_Qa);
      local_8 = exp(dVar1 / 3.0);
    }
    else {
      dVar1 = log(-in_XMM0_Qa);
      local_8 = exp(dVar1 / 3.0);
      local_8 = -local_8;
    }
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double CubicRoot(double x)
{
	if(x == 0.0)
		return 0.0;
	else if(x < 0.0)
		return -exp(log(-x)/3.0);
	else
		return exp(log(x)/3.0);
}